

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  pointer pbVar1;
  bool bVar2;
  pointer pcVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  byte bVar7;
  pointer pcVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  allocator local_359;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus status;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  Delimiter local_318;
  long local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  MacroPushPop macroScope;
  cmListFileFunction newLFF;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string local_268;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  char argvName [60];
  ostringstream argcDefStream;
  
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&expandedArgs,(char *)0x0);
  if ((ulong)((long)expandedArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expandedArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    std::__cxx11::string::string
              ((string *)&argcDefStream,"Macro invoked with incorrect arguments for macro named: ",
               (allocator *)&newLFF);
    std::__cxx11::string::append((string *)&argcDefStream);
    cmCommand::SetError(&this->super_cmCommand,(string *)&argcDefStream);
    std::__cxx11::string::~string((string *)&argcDefStream);
    bVar7 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&macroScope,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&argcDefStream);
    std::ostream::_M_insert<unsigned_long>((ulong)&argcDefStream);
    std::__cxx11::stringbuf::str();
    newLFF.super_cmCommandContext.Name._M_dataplus._M_p =
         (pointer)((long)expandedArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-0x20 - (long)(this->Args).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
    newLFF.super_cmCommandContext.Name._M_string_length =
         (size_type)
         expandedArgs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&expandedArgn,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&newLFF,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&expandedArgv,&expandedArgs,";");
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    variables.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&variables,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    for (uVar6 = 1;
        pbVar1 = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->Args).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar6 = (ulong)((int)uVar6 + 1)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argvName,
                     "${",pbVar1 + uVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newLFF,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argvName,
                     "}");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&variables,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newLFF);
      std::__cxx11::string::~string((string *)&newLFF);
      std::__cxx11::string::~string((string *)argvName);
    }
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    argVs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&argVs,(long)expandedArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)expandedArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)expandedArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)expandedArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar6 = (ulong)((int)uVar6 + 1)) {
      sprintf(argvName,"${ARGV%i}",uVar6);
      std::__cxx11::string::string((string *)&newLFF,argvName,(allocator *)&status);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argVs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newLFF);
      std::__cxx11::string::~string((string *)&newLFF);
    }
    paVar5 = &newLFF.super_cmCommandContext.Name.field_2;
    newLFF.super_cmCommandContext.Name._M_string_length = 0;
    newLFF.super_cmCommandContext.Name.field_2._M_local_buf[0] = '\0';
    newLFF.super_cmCommandContext.Line = 0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar11 = 0;
    newLFF.super_cmCommandContext.Name._M_dataplus._M_p = (pointer)paVar5;
    while( true ) {
      bVar7 = (byte)paVar5;
      uVar12 = (ulong)uVar11;
      uVar6 = (long)(this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Functions).
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6;
      if (uVar6 <= uVar12) break;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear(&newLFF.Arguments)
      ;
      pcVar3 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                (&newLFF.Arguments,
                 ((long)*(pointer *)
                         ((long)&pcVar3[uVar12].Arguments.
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 ._M_impl + 8) -
                 *(long *)&pcVar3[uVar12].Arguments.
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           ._M_impl) / 0x30);
      std::__cxx11::string::_M_assign((string *)&newLFF);
      pcVar3 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      newLFF.super_cmCommandContext.Line = pcVar3[uVar12].super_cmCommandContext.Line;
      for (pcVar8 = *(pointer *)
                     &pcVar3[uVar12].Arguments.
                      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                      _M_impl;
          pcVar8 != *(pointer *)
                     ((long)&pcVar3[uVar12].Arguments.
                             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                             ._M_impl + 8); pcVar8 = pcVar8 + 1) {
        _status = (pointer)&local_328;
        local_328._M_local_buf[0] = '\0';
        local_318 = Unquoted;
        local_310 = 0;
        std::__cxx11::string::_M_assign((string *)&status);
        if (pcVar8->Delim != Bracket) {
          for (uVar9 = 0; uVar10 = (ulong)uVar9,
              uVar10 < (ulong)((long)variables.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)variables.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar9 = uVar9 + 1) {
            cmsys::SystemTools::ReplaceString
                      ((string *)&status,
                       variables.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,
                       expandedArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
          }
          std::__cxx11::string::string((string *)&local_268,"${ARGC}",&local_359);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_268,&argcDef);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::string((string *)&local_268,"${ARGN}",&local_359);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_268,&expandedArgn);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::string((string *)&local_268,"${ARGV}",&local_359);
          cmsys::SystemTools::ReplaceString((string *)&status,&local_268,&expandedArgv);
          std::__cxx11::string::~string((string *)&local_268);
          lVar4 = std::__cxx11::string::find((char *)&status,0x5537a9);
          if (lVar4 != -1) {
            for (uVar9 = 0; uVar10 = (ulong)uVar9,
                uVar10 < (ulong)((long)expandedArgs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)expandedArgs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar9 = uVar9 + 1) {
              cmsys::SystemTools::ReplaceString
                        ((string *)&status,
                         argVs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10,
                         expandedArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10);
            }
          }
        }
        local_318 = pcVar8->Delim;
        local_310 = pcVar8->Line;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  (&newLFF.Arguments,(value_type *)&status);
        std::__cxx11::string::~string((string *)&status);
        pcVar3 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
      }
      _status = _status & 0xffffffff00000000;
      bVar2 = cmMakefile::ExecuteCommand((this->super_cmCommand).Makefile,&newLFF,&status);
      if ((!bVar2) || (status.NestedError == true)) {
        macroScope.ReportError = false;
        inStatus = (cmExecutionStatus *)&inStatus->NestedError;
        bVar7 = 0;
LAB_003c5d6c:
        inStatus->ReturnInvoked = true;
        break;
      }
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
      bVar7 = 1;
      if (status.ReturnInvoked != false) goto LAB_003c5d6c;
      if (status.BreakInvoked == true) {
        inStatus = (cmExecutionStatus *)&inStatus->BreakInvoked;
        goto LAB_003c5d6c;
      }
      uVar11 = uVar11 + 1;
    }
    bVar7 = uVar6 <= uVar12 | bVar7;
    cmListFileFunction::~cmListFileFunction(&newLFF);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&argVs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&variables);
    std::__cxx11::string::~string((string *)&expandedArgv);
    std::__cxx11::string::~string((string *)&expandedArgn);
    std::__cxx11::string::~string((string *)&argcDef);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&argcDefStream);
    cmMakefile::MacroPushPop::~MacroPushPop(&macroScope);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expandedArgs);
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass
(const std::vector<cmListFileArgument>& args,
 cmExecutionStatus &inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1)
    {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
    }

  cmMakefile::MacroPushPop macroScope(this->Makefile,
                                      this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit
      = expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j)
    {
    variables.push_back("${" + this->Args[j] + "}");
    }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j)
    {
    sprintf(argvName,"${ARGV%i}",j);
    argVs.push_back(argvName);
    }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for(unsigned int c = 0; c < this->Functions.size(); ++c)
    {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(this->Functions[c].Arguments.size());
    newLFF.Name = this->Functions[c].Name;
    newLFF.Line = this->Functions[c].Line;

    // for each argument of the current function
    for (std::vector<cmListFileArgument>::iterator k =
           this->Functions[c].Arguments.begin();
         k != this->Functions[c].Arguments.end(); ++k)
      {
      cmListFileArgument arg;
      arg.Value = k->Value;
      if(k->Delim != cmListFileArgument::Bracket)
        {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j)
          {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
          }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos)
          {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t)
            {
            cmSystemTools::ReplaceString(arg.Value, argVs[t],
                                         expandedArgs[t]);
            }
          }
        }
      arg.Delim = k->Delim;
      arg.Line = k->Line;
      newLFF.Arguments.push_back(arg);
      }
    cmExecutionStatus status;
    if(!this->Makefile->ExecuteCommand(newLFF, status) ||
       status.GetNestedError())
      {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError(true);
      return false;
      }
    if (status.GetReturnInvoked())
      {
      inStatus.SetReturnInvoked(true);
      return true;
      }
    if (status.GetBreakInvoked())
      {
      inStatus.SetBreakInvoked(true);
      return true;
      }
    }
  return true;
}